

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O3

void __thiscall
HighsLpRelaxation::LpRow::get
          (LpRow *this,HighsMipSolver *mipsolver,HighsInt *len,HighsInt **inds,double **vals)

{
  int iVar1;
  HighsMipSolverData *pHVar2;
  long lVar3;
  vector<double,_std::allocator<double>_> *pvVar4;
  long lVar5;
  
  if (this->origin == kModel) {
    pHVar2 = (mipsolver->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    lVar3 = *(long *)&(pHVar2->ARstart_).super__Vector_base<int,_std::allocator<int>_>._M_impl;
    iVar1 = *(int *)(lVar3 + (long)this->index * 4);
    lVar5 = (long)iVar1;
    *len = *(int *)(lVar3 + 4 + (long)this->index * 4) - iVar1;
    *inds = (HighsInt *)
            (lVar5 * 4 +
            *(long *)&(pHVar2->ARindex_).super__Vector_base<int,_std::allocator<int>_>._M_impl);
    pvVar4 = &pHVar2->ARvalue_;
  }
  else {
    if (this->origin != kCutPool) {
      return;
    }
    pHVar2 = (mipsolver->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    lVar3 = *(long *)&(pHVar2->cutpool).matrix_.ARrange_;
    iVar1 = *(int *)(lVar3 + (long)this->index * 8);
    lVar5 = (long)iVar1;
    *len = *(int *)(lVar3 + 4 + (long)this->index * 8) - iVar1;
    *inds = (HighsInt *)
            (lVar5 * 4 +
            *(long *)&(((vector<int,_std::allocator<int>_> *)
                       ((long)&(pHVar2->cutpool).matrix_ + 0x18))->
                      super__Vector_base<int,_std::allocator<int>_>)._M_impl);
    pvVar4 = (vector<double,_std::allocator<double>_> *)((long)&(pHVar2->cutpool).matrix_ + 0x30);
  }
  *vals = (double *)
          (lVar5 * 8 +
          *(long *)&(pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl);
  return;
}

Assistant:

void HighsLpRelaxation::LpRow::get(const HighsMipSolver& mipsolver,
                                   HighsInt& len, const HighsInt*& inds,
                                   const double*& vals) const {
  switch (origin) {
    case kCutPool:
      mipsolver.mipdata_->cutpool.getCut(index, len, inds, vals);
      break;
    case kModel:
      mipsolver.mipdata_->getRow(index, len, inds, vals);
  };
}